

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O3

ON_SubDFace * __thiscall ON_SubDLevel::AddFace(ON_SubDLevel *this,ON_SubDFace *face)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ON_SubDFace *pOVar1;
  
  if (face != (ON_SubDFace *)0x0) {
    if (this->m_face[1] == (ON_SubDFace *)0x0) {
      this->m_face[0] = face;
      pOVar1 = (ON_SubDFace *)0x0;
    }
    else {
      this->m_face[1]->m_next_face = face;
      pOVar1 = this->m_face[1];
    }
    face->m_prev_face = pOVar1;
    this->m_face[1] = face;
    face->m_next_face = (ON_SubDFace *)0x0;
    this->m_face_count = this->m_face_count + 1;
    if (this->m_face_array_count != 0) {
      this->m_face_array_count = 0;
      this_00 = (this->m_face_array).
                super___shared_ptr<const_ON_SubDFace_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->m_face_array).super___shared_ptr<const_ON_SubDFace_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->m_face_array).super___shared_ptr<const_ON_SubDFace_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return face;
}

Assistant:

const ON_SubDFace* AddFace(class ON_SubDFace* face)
  {
    if (nullptr == face)
      return nullptr;
    if (nullptr == m_face[1])
    {
      m_face[0] = face;
      face->m_prev_face = nullptr;
    }
    else
    {
      m_face[1]->m_next_face = face;
      face->m_prev_face = m_face[1];
    }
    m_face[1] = face;
    face->m_next_face = nullptr;
    m_face_count++;
    ResetFaceArray();
    return face;
  }